

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O1

void __thiscall
Centaurus::CharClass<unsigned_char>::parse(CharClass<unsigned_char> *this,Stream *stream)

{
  pointer pRVar1;
  pointer pRVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t ch;
  wchar_t ch_00;
  StreamException *__return_storage_ptr__;
  char cVar5;
  wchar_t wVar6;
  int iVar7;
  CharClass<unsigned_char> local_68;
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  local_48;
  
  wVar4 = Stream::get(stream);
  ch = wVar4;
  if (wVar4 == L'^') {
    ch = Stream::get(stream);
  }
  wVar6 = L'\0';
  iVar7 = 0;
  do {
    cVar5 = (char)wVar6;
    if (ch == L']') {
      if (iVar7 == 1) {
        local_68._vptr_CharClass = (_func_int **)&PTR__Range_001c96d8;
        local_68.m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = CONCAT11(cVar5 + '\x01',cVar5);
        operator|=(this,(Range<unsigned_char> *)&local_68);
      }
      else if (iVar7 == 2) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L']');
LAB_00131637:
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
      pRVar1 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar1 != pRVar2) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pRVar1,pRVar2,(int)LZCOUNT((long)pRVar2 - (long)pRVar1 >> 4) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pRVar1,pRVar2);
      }
      if (wVar4 == L'^') {
        operator~(&local_68,this);
        local_48.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_68.m_ranges.
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.m_ranges.
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (this->m_ranges).
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.m_ranges.
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
        ~vector(&local_48);
        ~CharClass(&local_68);
      }
      return;
    }
    if ((ch == L'\xffff') || (ch == L'\0')) {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,ch);
      goto LAB_00131637;
    }
    ch_00 = ch;
    if (ch == L'\\') {
      ch_00 = Stream::get(stream);
      if (ch_00 < L'[') {
        if (ch_00 < L'R') {
          if (ch_00 != L'-') {
            if (ch_00 == L'N') goto LAB_0013145b;
            goto LAB_0013168b;
          }
        }
        else if (ch_00 == L'R') {
LAB_00131453:
          ch_00 = L'\r';
        }
        else {
          if (ch_00 != L'T') goto LAB_0013168b;
LAB_0013144b:
          ch_00 = L'\t';
        }
      }
      else if (ch_00 < L'n') {
        if (2 < (uint)(ch_00 + L'\xffffffa5')) {
LAB_0013168b:
          __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(__return_storage_ptr__,stream,ch_00);
          goto LAB_00131637;
        }
      }
      else {
        if (ch_00 != L'n') {
          if (ch_00 == L'r') goto LAB_00131453;
          if (ch_00 == L't') goto LAB_0013144b;
          goto LAB_0013168b;
        }
LAB_0013145b:
        ch_00 = L'\n';
      }
    }
    bVar3 = ch_00 == L'-' && ch != L'\\';
    if (iVar7 == 2) {
      if (bVar3) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_00131637;
      }
      local_68._vptr_CharClass = (_func_int **)&PTR__Range_001c96d8;
      local_68.m_ranges.
      super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = CONCAT11((char)ch_00 + '\x01',cVar5);
      operator|=(this,(Range<unsigned_char> *)&local_68);
      iVar7 = 0;
    }
    else if (iVar7 == 1) {
      iVar7 = 2;
      if (ch_00 != L'-' || ch == L'\\') {
        local_68._vptr_CharClass = (_func_int **)&PTR__Range_001c96d8;
        local_68.m_ranges.
        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = CONCAT11(cVar5 + '\x01',cVar5);
        operator|=(this,(Range<unsigned_char> *)&local_68);
        iVar7 = 1;
        wVar6 = ch_00;
      }
    }
    else {
      iVar7 = 1;
      wVar6 = ch_00;
      if (bVar3) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,L'-');
        goto LAB_00131637;
      }
    }
    ch = Stream::get(stream);
  } while( true );
}

Assistant:

void CharClass<TCHAR>::parse(Stream& stream)
{
    wchar_t ch;
    bool invert_flag = false;

    ch = stream.get();
    if (ch == L'^')
    {
        invert_flag = true;
        ch = stream.get();
    }

    wchar_t start = 0;
    enum
    {
        CC_STATE_START = 0,
        CC_STATE_RANGE,
        CC_STATE_END
    } state = CC_STATE_START;
    for (; ch != L']'; ch = stream.get())
    {
        bool escaped = false;

        if (ch == L'\0' || ch == 0xFFFF)
            throw stream.unexpected(ch);

        if (ch == L'\\')
        {
            ch = stream.get();
            switch (ch)
            {
            case L'\\':
                ch = L'\\';
                break;
            case L'-':
                ch = L'-';
                break;
            case L'[':
                ch = L'[';
                break;
            case L']':
                ch = L']';
                break;
            case L't':
            case L'T':
                ch = L'\t';
                break;
            case L'r':
            case L'R':
                ch = L'\r';
                break;
            case L'n':
            case L'N':
                ch = L'\n';
                break;
            default:
                throw stream.unexpected(ch);
            }
            escaped = true;
        }
        switch (state)
        {
        case CC_STATE_START:
            if (!escaped && ch == L'-')
                throw stream.unexpected(ch);
            start = ch;
            state = CC_STATE_RANGE;
            break;
        case CC_STATE_RANGE:
            if (!escaped && ch == L'-')
            {
                state = CC_STATE_END;
            }
            else
            {
                *this |= Range<TCHAR>(start, start + 1);
                start = ch;
                state = CC_STATE_RANGE;
            }
            break;
        case CC_STATE_END:
            if (!escaped && ch == L'-')
            {
                throw stream.unexpected(ch);
            }
            else
            {
                *this |= Range<TCHAR>(start, ch + 1);
                state = CC_STATE_START;
            }
            break;
        }
    }
    if (state == CC_STATE_RANGE)
    {
        *this |= Range<TCHAR>(start, start + 1);
    }
    else if (state == CC_STATE_END)
    {
        throw stream.unexpected(L']');
    }

	std::sort(m_ranges.begin(), m_ranges.end());

	if (invert_flag)
	{
		*this = this->operator~();
	}
}